

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

void __thiscall
lf::mesh::utils::
MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
::MeshFunctionUnary(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
                    *this,long param_2)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  MeshFunctionVelocity<double,_double> *pMVar3;
  
  uVar1 = *(undefined8 *)(param_2 + 0x18);
  (this->mf_).a_.level_coarse_ = (int)uVar1;
  (this->mf_).a_.level_fine_ = (int)((ulong)uVar1 >> 0x20);
  pMVar3 = *(MeshFunctionVelocity<double,_double> **)(param_2 + 0x10);
  (this->mf_).a_.mh_ = *(MeshHierarchy **)(param_2 + 8);
  (this->mf_).a_.mf_ = pMVar3;
  (this->mf_).b_.grad_.fe_space_.
  super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(param_2 + 0x20);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(param_2 + 0x28);
  (this->mf_).b_.grad_.fe_space_.
  super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&(this->mf_).b_.grad_.dof_vector_,
             (DenseStorage<double,__1,__1,_1,_0> *)(param_2 + 0x30));
  return;
}

Assistant:

MeshFunctionUnary(OP op, MF mf) : op_(std::move(op)), mf_(std::move(mf)) {}